

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointcloud.cc
# Opt level: O0

void __thiscall gvr::PointCloud::saveSTL(PointCloud *this,char *name)

{
  undefined8 uVar1;
  IOException *in_RSI;
  allocator local_31;
  string local_30 [24];
  string *in_stack_ffffffffffffffe8;
  
  uVar1 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"Cannot store point cloud in STL format. STL is a triangle format.",&local_31)
  ;
  gutil::IOException::IOException(in_RSI,in_stack_ffffffffffffffe8);
  __cxa_throw(uVar1,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void PointCloud::saveSTL(const char *name) const
{
  throw gutil::IOException("Cannot store point cloud in STL format. STL is a triangle format.");
}